

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerator.cxx
# Opt level: O3

bool __thiscall cmQtAutoGenerator::InfoT::GetUInt(InfoT *this,string *key,uint *value,bool required)

{
  bool bVar1;
  bool bVar2;
  UInt UVar3;
  Value *this_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string_view message;
  string local_78;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_58;
  undefined8 local_40;
  char *local_38;
  undefined8 local_30;
  
  this_00 = Json::Value::operator[](&this->Json_,key);
  bVar1 = Json::Value::isUInt(this_00);
  if (bVar1) {
    UVar3 = Json::Value::asUInt(this_00);
    *value = UVar3;
    bVar2 = true;
  }
  else {
    bVar1 = Json::Value::isNull(this_00);
    bVar2 = true;
    if (!bVar1 || required) {
      local_58.first._M_str = (key->_M_dataplus)._M_p;
      local_58.first._M_len = key->_M_string_length;
      local_58.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_40 = 0x1c;
      local_38 = " is not an unsigned integer.";
      local_30 = 0;
      views._M_len = 2;
      views._M_array = &local_58;
      cmCatViews(&local_78,views);
      message._M_str = local_78._M_dataplus._M_p;
      message._M_len = local_78._M_string_length;
      LogError(this,this->Gen_->GenType_,message);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      bVar2 = false;
    }
  }
  return bVar2;
}

Assistant:

bool cmQtAutoGenerator::InfoT::GetUInt(std::string const& key,
                                       unsigned int& value,
                                       bool required) const
{
  Json::Value const& jval = this->Json_[key];
  if (jval.isUInt()) {
    value = jval.asUInt();
  } else {
    if (!jval.isNull() || required) {
      return this->LogError(cmStrCat(key, " is not an unsigned integer."));
    }
  }
  return true;
}